

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_elements_transaction.cpp
# Opt level: O2

int CfdUpdateConfidentialTxOut
              (void *handle,char *tx_hex_string,uint32_t index,char *asset_string,
              int64_t value_satoshi,char *value_commitment,char *address,char *direct_locking_script
              ,char *nonce,char **tx_string)

{
  bool bVar1;
  char *pcVar2;
  CfdException *pCVar3;
  Script *this;
  Amount AVar4;
  Script locking_script;
  Script local_390;
  string addr;
  ConfidentialValue value;
  ConfidentialValue temp_value;
  ConfidentialNonce nonce_obj;
  ConfidentialAssetId asset_obj;
  ElementsAddressFactory address_factory;
  ConfidentialTransactionContext ctx;
  
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString(tx_hex_string);
  if (bVar1) {
    temp_value._vptr_ConfidentialValue = (_func_int **)0x4fbb12;
    temp_value.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
    .super__Vector_impl_data._M_start._0_4_ = 0x140;
    temp_value.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
    .super__Vector_impl_data._M_finish = "CfdUpdateConfidentialTxOut";
    cfd::core::logger::warn<>((CfdSourceLocation *)&temp_value,"tx is null or empty.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&temp_value,"Failed to parameter. tx is null or empty.",(allocator *)&ctx);
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&temp_value);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (tx_string == (char **)0x0) {
    temp_value._vptr_ConfidentialValue = (_func_int **)0x4fbb12;
    temp_value.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
    .super__Vector_impl_data._M_start._0_4_ = 0x146;
    temp_value.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
    .super__Vector_impl_data._M_finish = "CfdUpdateConfidentialTxOut";
    cfd::core::logger::warn<>((CfdSourceLocation *)&temp_value,"tx output is null.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&temp_value,"Failed to parameter. tx output is null.",(allocator *)&ctx);
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&temp_value);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(asset_string);
  if (bVar1) {
    temp_value._vptr_ConfidentialValue = (_func_int **)0x4fbb12;
    temp_value.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
    .super__Vector_impl_data._M_start._0_4_ = 0x14c;
    temp_value.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
    .super__Vector_impl_data._M_finish = "CfdUpdateConfidentialTxOut";
    cfd::core::logger::warn<>((CfdSourceLocation *)&temp_value,"asset is null or empty.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&temp_value,"Failed to parameter. asset is null or empty.",
               (allocator *)&ctx);
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&temp_value);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  std::__cxx11::string::string((string *)&temp_value,tx_hex_string,(allocator *)&locking_script);
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext(&ctx,(string *)&temp_value);
  std::__cxx11::string::~string((string *)&temp_value);
  bVar1 = cfd::ConfidentialTransactionContext::HasBlinding(&ctx);
  if (bVar1) {
    temp_value._vptr_ConfidentialValue = (_func_int **)0x4fbb12;
    temp_value.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
    .super__Vector_impl_data._M_start._0_4_ = 0x154;
    temp_value.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
    .super__Vector_impl_data._M_finish = "CfdUpdateConfidentialTxOut";
    cfd::core::logger::warn<>((CfdSourceLocation *)&temp_value,"tx is already blinded.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&temp_value,"Failed to blinded. this function can use unblind tx only.",
               (allocator *)&locking_script);
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalStateError,(string *)&temp_value);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  cfd::core::ConfidentialValue::ConfidentialValue(&value);
  bVar1 = cfd::capi::IsEmptyString(value_commitment);
  if (bVar1) {
    AVar4 = cfd::core::Amount::CreateBySatoshiAmount(value_satoshi);
    locking_script._vptr_Script = (_func_int **)AVar4.amount_;
    locking_script.script_data_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = AVar4.ignore_check_;
    cfd::core::ConfidentialValue::ConfidentialValue(&temp_value,(Amount *)&locking_script);
    cfd::core::ConfidentialValue::operator=(&value,&temp_value);
  }
  else {
    std::__cxx11::string::string((string *)&locking_script,value_commitment,(allocator *)&local_390)
    ;
    cfd::core::ConfidentialValue::ConfidentialValue(&temp_value,(string *)&locking_script);
    std::__cxx11::string::~string((string *)&locking_script);
    bVar1 = cfd::core::ConfidentialValue::HasBlinding(&temp_value);
    if (!bVar1) {
      cfd::core::ConfidentialValue::operator=(&value,&temp_value);
    }
  }
  cfd::core::ConfidentialValue::~ConfidentialValue(&temp_value);
  cfd::ElementsAddressFactory::ElementsAddressFactory(&address_factory);
  std::__cxx11::string::string((string *)&temp_value,asset_string,(allocator *)&locking_script);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(&asset_obj,(string *)&temp_value);
  std::__cxx11::string::~string((string *)&temp_value);
  cfd::core::ConfidentialNonce::ConfidentialNonce(&nonce_obj);
  bVar1 = cfd::capi::IsEmptyString(nonce);
  if (!bVar1) {
    std::__cxx11::string::string((string *)&locking_script,nonce,(allocator *)&local_390);
    cfd::core::ConfidentialNonce::ConfidentialNonce
              ((ConfidentialNonce *)&temp_value,(string *)&locking_script);
    cfd::core::ConfidentialNonce::operator=(&nonce_obj,(ConfidentialNonce *)&temp_value);
    cfd::core::ConfidentialNonce::~ConfidentialNonce((ConfidentialNonce *)&temp_value);
    std::__cxx11::string::~string((string *)&locking_script);
  }
  cfd::core::Script::Script(&locking_script);
  bVar1 = cfd::capi::IsEmptyString(address);
  if (bVar1) {
    bVar1 = cfd::capi::IsEmptyString(direct_locking_script);
    if (bVar1) goto LAB_00363150;
    std::__cxx11::string::string((string *)&local_390,direct_locking_script,(allocator *)&addr);
    cfd::core::Script::Script((Script *)&temp_value,(string *)&local_390);
    cfd::core::Script::operator=(&locking_script,(Script *)&temp_value);
    cfd::core::Script::~Script((Script *)&temp_value);
    this = &local_390;
  }
  else {
    std::__cxx11::string::string((string *)&addr,address,(allocator *)&temp_value);
    bVar1 = cfd::core::ElementsConfidentialAddress::IsConfidentialAddress(&addr);
    if (bVar1) {
      cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
                ((ElementsConfidentialAddress *)&temp_value,&addr);
      cfd::core::ElementsConfidentialAddress::GetLockingScript
                (&local_390,(ElementsConfidentialAddress *)&temp_value);
      cfd::core::Script::operator=(&locking_script,&local_390);
      cfd::core::Script::~Script(&local_390);
      cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress
                ((ElementsConfidentialAddress *)&temp_value);
    }
    else {
      cfd::AddressFactory::GetAddress
                ((Address *)&temp_value,&address_factory.super_AddressFactory,&addr);
      cfd::core::Address::GetLockingScript(&local_390,(Address *)&temp_value);
      cfd::core::Script::operator=(&locking_script,&local_390);
      cfd::core::Script::~Script(&local_390);
      cfd::core::Address::~Address((Address *)&temp_value);
    }
    this = (Script *)&addr;
  }
  std::__cxx11::string::~string((string *)this);
LAB_00363150:
  cfd::core::ByteData::ByteData((ByteData *)&temp_value);
  cfd::core::ByteData::ByteData((ByteData *)&local_390);
  cfd::core::ConfidentialTransaction::SetTxOutCommitment
            (&ctx.super_ConfidentialTransaction,index,&asset_obj,&value,&nonce_obj,
             (ByteData *)&temp_value,(ByteData *)&local_390);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_390);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&temp_value);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_
            ((string *)&temp_value,(AbstractTransaction *)&ctx);
  pcVar2 = cfd::capi::CreateString((string *)&temp_value);
  *tx_string = pcVar2;
  std::__cxx11::string::~string((string *)&temp_value);
  cfd::core::Script::~Script(&locking_script);
  cfd::core::ConfidentialNonce::~ConfidentialNonce(&nonce_obj);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId(&asset_obj);
  cfd::AddressFactory::~AddressFactory(&address_factory.super_AddressFactory);
  cfd::core::ConfidentialValue::~ConfidentialValue(&value);
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext(&ctx);
  return 0;
}

Assistant:

int CfdUpdateConfidentialTxOut(
    void* handle, const char* tx_hex_string, uint32_t index,
    const char* asset_string, int64_t value_satoshi,
    const char* value_commitment, const char* address,
    const char* direct_locking_script, const char* nonce, char** tx_string) {
  try {
    cfd::Initialize();
    if (IsEmptyString(tx_hex_string)) {
      warn(CFD_LOG_SOURCE, "tx is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx is null or empty.");
    }
    if (tx_string == nullptr) {
      warn(CFD_LOG_SOURCE, "tx output is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx output is null.");
    }
    if (IsEmptyString(asset_string)) {
      warn(CFD_LOG_SOURCE, "asset is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. asset is null or empty.");
    }

    ConfidentialTransactionContext ctx(tx_hex_string);
    if (ctx.HasBlinding()) {
      warn(CFD_LOG_SOURCE, "tx is already blinded.");
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Failed to blinded. this function can use unblind tx only.");
    }

    ConfidentialValue value;
    if (IsEmptyString(value_commitment)) {
      value = ConfidentialValue(Amount::CreateBySatoshiAmount(value_satoshi));
    } else {
      ConfidentialValue temp_value = ConfidentialValue(value_commitment);
      // unconfidential only
      if (!temp_value.HasBlinding()) value = temp_value;
    }

    // add TxOut
    ElementsAddressFactory address_factory;
    ConfidentialAssetId asset_obj(asset_string);
    ConfidentialNonce nonce_obj;
    if (!IsEmptyString(nonce)) {
      nonce_obj = ConfidentialNonce(std::string(nonce));
    }
    Script locking_script;
    if (!IsEmptyString(address)) {
      const std::string addr(address);
      if (ElementsConfidentialAddress::IsConfidentialAddress(addr)) {
        ElementsConfidentialAddress confidential_addr(addr);
        locking_script = confidential_addr.GetLockingScript();
      } else {
        Address unconfidential_addr = address_factory.GetAddress(addr);
        locking_script = unconfidential_addr.GetLockingScript();
      }
    } else if (!IsEmptyString(direct_locking_script)) {
      locking_script = Script(std::string(direct_locking_script));
    }

    ctx.SetTxOutCommitment(
        index, asset_obj, value, nonce_obj, ByteData(), ByteData());
    *tx_string = CreateString(ctx.GetHex());

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}